

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::CullingTest::iterate(CullingTest *this)

{
  Vec4 *pVVar1;
  uint uVar2;
  GLenum GVar3;
  pointer pVVar4;
  undefined1 auVar5 [8];
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  char *pcVar11;
  size_t sVar12;
  RenderTarget *pRVar13;
  Vec4 *pVVar14;
  long lVar15;
  Vec4 *pVVar16;
  CullingTest *pCVar17;
  _func_int ***v1;
  Vec4 *v0;
  long lVar18;
  _func_int ***v0_00;
  long lVar19;
  float fVar20;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  RasterizationArguments args;
  Surface resultImage;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_238;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_218;
  uint local_1f4;
  CullingTest *local_1f0;
  RasterizationArguments local_1e4;
  Surface local_1d0;
  undefined1 local_1b8 [8];
  pointer pSStack_1b0;
  pointer local_1a8;
  TestContext *pTStack_1a0;
  _func_int **local_198;
  TestContext *pTStack_190;
  float local_188 [12];
  bool local_158;
  bool local_157;
  bool local_156;
  ios_base local_140 [272];
  
  iVar10 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_1d0,iVar10,iVar10);
  local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init((deRandom *)local_1b8,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&local_238,6);
  if (0 < (int)((ulong)((long)local_238.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_238.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar15 = 0;
    lVar18 = 0;
    do {
      fVar20 = deRandom_getFloat((deRandom *)local_1b8);
      *(float *)((long)&(((BaseRenderingCase *)
                         (local_238.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                        super_TestCase.super_TestNode._vptr_TestNode + lVar15) = fVar20 * 1.8 + -0.9
      ;
      fVar20 = deRandom_getFloat((deRandom *)local_1b8);
      *(float *)((long)&(((BaseRenderingCase *)
                         (local_238.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                        super_TestCase.super_TestNode._vptr_TestNode + lVar15 + 4) =
           fVar20 * 1.8 + -0.9;
      *(undefined8 *)
       ((long)&(((BaseRenderingCase *)
                (local_238.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).super_TestCase.
               super_TestNode.m_testCtx + lVar15) = 0x3f80000000000000;
      lVar18 = lVar18 + 1;
      lVar15 = lVar15 + 0x10;
    } while (lVar18 < (int)((ulong)((long)local_238.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_238.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  uVar2 = this->m_cullMode;
  pVVar14 = (Vec4 *)(ulong)uVar2;
  local_1f0 = this;
  if (uVar2 != 0x408) {
    bVar9 = (uVar2 == 0x404) != (this->m_faceOrder == 0x901);
    GVar3 = this->m_primitive;
    if (GVar3 == 4) {
      if (0 < (int)((ulong)((long)local_238.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        iVar10 = 0;
        do {
          pCVar17 = (CullingTest *)
                    (&(((BaseRenderingCase *)
                       (local_238.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                      super_TestCase.super_TestNode._vptr_TestNode + (long)iVar10 * 2);
          v0_00 = &(((BaseRenderingCase *)
                    (local_238.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                   super_TestCase.super_TestNode._vptr_TestNode + (long)(iVar10 + 1) * 2;
          v1 = &(((BaseRenderingCase *)
                 (local_238.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestCase).
                super_TestCase.super_TestNode._vptr_TestNode + (long)(int)(iVar10 + 2U) * 2;
          bVar8 = triangleOrder(pCVar17,(Vec4 *)v0_00,(Vec4 *)v1,(Vec4 *)(ulong)(iVar10 + 2U));
          if (bVar9 != bVar8) {
            local_188[8] = 0.0;
            local_188[9] = 0.0;
            local_188[10] = 0.0;
            local_188[0xb] = 0.0;
            local_188[4] = 0.0;
            local_188[5] = 0.0;
            local_188[6] = 0.0;
            local_188[7] = 0.0;
            local_188[0] = 0.0;
            local_188[1] = 0.0;
            local_188[2] = 0.0;
            local_188[3] = 0.0;
            local_1b8 = (undefined1  [8])
                        (pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode;
            pSStack_1b0 = (pointer)(pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx;
            local_158 = false;
            local_1a8 = (pointer)*v0_00;
            pTStack_1a0 = (TestContext *)v0_00[1];
            local_157 = false;
            local_198 = *v1;
            pTStack_190 = (TestContext *)v1[1];
            local_156 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_218,(value_type *)local_1b8);
          }
          iVar10 = iVar10 + 3;
        } while (iVar10 < (int)((ulong)((long)local_238.
                                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_238.
                                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2);
      }
    }
    else if (GVar3 == 5) {
      if (0 < (int)((ulong)((long)local_238.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
        pVVar14 = (Vec4 *)(ulong)bVar9;
        local_1f4 = (uint)bVar9;
        lVar19 = 0x200000000;
        lVar18 = 0x10;
        lVar15 = 0;
        do {
          pVVar4 = local_238.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar1 = (Vec4 *)((long)&(((BaseRenderingCase *)
                                    (local_238.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                   super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                           lVar18);
          pCVar17 = (CullingTest *)
                    ((long)local_238.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar18 + -0x10);
          pVVar16 = (Vec4 *)((long)&(((BaseRenderingCase *)
                                     (local_238.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                    super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                            (lVar19 >> 0x1c));
          bVar9 = triangleOrder(pCVar17,pVVar1,pVVar16,pVVar14);
          if (((uint)lVar15 & 1 ^ local_1f4) != (uint)bVar9) {
            local_188[8] = 0.0;
            local_188[9] = 0.0;
            local_188[10] = 0.0;
            local_188[0xb] = 0.0;
            local_188[4] = 0.0;
            local_188[5] = 0.0;
            local_188[6] = 0.0;
            local_188[7] = 0.0;
            local_188[0] = 0.0;
            local_188[1] = 0.0;
            local_188[2] = 0.0;
            local_188[3] = 0.0;
            local_1b8 = (undefined1  [8])
                        (pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode;
            pSStack_1b0 = *(pointer *)((long)pVVar4 + lVar18 + -8);
            local_158 = false;
            local_1a8 = *(pointer *)pVVar1->m_data;
            pTStack_1a0 = *(TestContext **)(pVVar1->m_data + 2);
            local_157 = false;
            local_198 = *(_func_int ***)pVVar16->m_data;
            pTStack_190 = *(TestContext **)(pVVar16->m_data + 2);
            local_156 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_218,(value_type *)local_1b8);
          }
          lVar15 = lVar15 + 1;
          pVVar14 = (Vec4 *)(((long)local_238.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_238.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 +
                             -0x200000000 >> 0x20);
          lVar19 = lVar19 + 0x100000000;
          lVar18 = lVar18 + 0x10;
        } while (lVar15 < (long)pVVar14);
      }
    }
    else if ((GVar3 == 6) &&
            (1 < (int)((ulong)((long)local_238.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_238.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1)) {
      lVar18 = 1;
      lVar15 = 0x20;
      do {
        pVVar4 = local_238.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar1 = (Vec4 *)((long)&(((BaseRenderingCase *)
                                  (local_238.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                 super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                         lVar15);
        pVVar16 = (Vec4 *)((long)local_238.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x10);
        bVar8 = triangleOrder((CullingTest *)
                              local_238.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,pVVar16,pVVar1,pVVar14);
        if (bVar9 != bVar8) {
          local_188[8] = 0.0;
          local_188[9] = 0.0;
          local_188[10] = 0.0;
          local_188[0xb] = 0.0;
          local_188[4] = 0.0;
          local_188[5] = 0.0;
          local_188[6] = 0.0;
          local_188[7] = 0.0;
          local_188[0] = 0.0;
          local_188[1] = 0.0;
          local_188[2] = 0.0;
          local_188[3] = 0.0;
          local_1b8 = (undefined1  [8])
                      (((BaseRenderingCase *)pVVar4->m_data)->super_TestCase).super_TestCase.
                      super_TestNode._vptr_TestNode;
          pSStack_1b0 = (pointer)(((BaseRenderingCase *)pVVar4->m_data)->super_TestCase).
                                 super_TestCase.super_TestNode.m_testCtx;
          local_158 = false;
          local_1a8 = *(pointer *)pVVar16->m_data;
          pTStack_1a0 = *(TestContext **)((long)pVVar4 + lVar15 + -8);
          local_157 = false;
          local_198 = *(_func_int ***)pVVar1->m_data;
          pTStack_190 = *(TestContext **)(pVVar1->m_data + 2);
          local_156 = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back(&local_218,(value_type *)local_1b8);
        }
        lVar18 = lVar18 + 1;
        pVVar14 = (Vec4 *)0xffffffff00000000;
        lVar15 = lVar15 + 0x10;
      } while (lVar18 < ((long)local_238.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_238.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000
                        >> 0x20);
    }
  }
  pCVar17 = local_1f0;
  iVar10 = (*((local_1f0->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar10);
  (**(code **)(lVar15 + 0x5e0))(0xb44);
  (**(code **)(lVar15 + 0x418))(pCVar17->m_cullMode);
  (**(code **)(lVar15 + 0x6c0))(pCVar17->m_faceOrder);
  local_1b8 = (undefined1  [8])
              ((pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1b0,"Setting front face to ",0x16);
  pcVar11 = glu::getWindingName(pCVar17->m_faceOrder);
  iVar10 = (int)(ostringstream *)&pSStack_1b0;
  if (pcVar11 == (char *)0x0) {
    std::ios::clear(iVar10 + (int)*(undefined8 *)(pSStack_1b0[-1].colors[1].m_data + 3));
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,pcVar11,sVar12);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])
              ((pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1b0,"Setting cull face to ",0x15);
  pcVar11 = glu::getFaceName(pCVar17->m_cullMode);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear(iVar10 + (int)*(undefined8 *)(pSStack_1b0[-1].colors[1].m_data + 3));
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,pcVar11,sVar12);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])
              ((pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1b0,"Drawing test pattern (",0x16);
  pcVar11 = glu::getPrimitiveTypeName(pCVar17->m_primitive);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear(iVar10 + (int)*(undefined8 *)(pSStack_1b0[-1].colors[1].m_data + 3));
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,pcVar11,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1b0,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1b0);
  std::ios_base::~ios_base(local_140);
  BaseRenderingCase::drawPrimitives
            (&pCVar17->super_BaseRenderingCase,&local_1d0,&local_238,pCVar17->m_primitive);
  local_1b8 = (undefined1  [8])0x0;
  pSStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  local_1e4.numSamples = (pCVar17->super_BaseRenderingCase).m_numSamples;
  local_1e4.subpixelBits = (pCVar17->super_BaseRenderingCase).m_subpixelBits;
  pRVar13 = Context::getRenderTarget((pCVar17->super_BaseRenderingCase).super_TestCase.m_context);
  local_1e4.redBits = (pRVar13->m_pixelFormat).redBits;
  pRVar13 = Context::getRenderTarget((pCVar17->super_BaseRenderingCase).super_TestCase.m_context);
  local_1e4.greenBits = (pRVar13->m_pixelFormat).greenBits;
  pRVar13 = Context::getRenderTarget((pCVar17->super_BaseRenderingCase).super_TestCase.m_context);
  pSVar7 = local_1a8;
  pSVar6 = pSStack_1b0;
  auVar5 = local_1b8;
  local_1e4.blueBits = (pRVar13->m_pixelFormat).blueBits;
  local_1b8 = (undefined1  [8])
              local_218.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pSStack_1b0 = local_218.
                super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8 = local_218.
              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_218.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar5;
  local_218.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
  local_218.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar7;
  bVar9 = tcu::verifyTriangleGroupRasterization
                    (&local_1d0,(TriangleSceneSpec *)local_1b8,&local_1e4,
                     ((pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log,VERIFICATIONMODE_WEAK);
  pcVar11 = "Incorrect rendering";
  if (bVar9) {
    pcVar11 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pCVar17->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)!bVar9,pcVar11);
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  if (local_218.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((CullingTest *)
      local_238.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (CullingTest *)0x0) {
    operator_delete(local_238.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_1d0);
  return STOP;
}

Assistant:

CullingTest::IterateResult CullingTest::iterate (void)
{
	tcu::Surface									resultImage(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	// draw image
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.enable(GL_CULL_FACE);
		gl.cullFace(m_cullMode);
		gl.frontFace(m_faceOrder);

		m_testCtx.getLog() << tcu::TestLog::Message << "Setting front face to " << glu::getWindingName(m_faceOrder) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Setting cull face to " << glu::getFaceName(m_cullMode) << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing test pattern (" << glu::getPrimitiveTypeName(m_primitive) << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitive);
	}

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;

		args.numSamples		= m_numSamples;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= m_context.getRenderTarget().getPixelFormat().redBits;
		args.greenBits		= m_context.getRenderTarget().getPixelFormat().greenBits;
		args.blueBits		= m_context.getRenderTarget().getPixelFormat().blueBits;

		scene.triangles.swap(triangles);

		if (verifyTriangleGroupRasterization(resultImage, scene, args, m_testCtx.getLog(), tcu::VERIFICATIONMODE_WEAK))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering");
	}

	return STOP;
}